

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_fkhash_nlm.hpp
# Opt level: O0

pair<const_int_*,_unsigned_long> __thiscall
poplar::compact_fkhash_nlm<int,_16UL>::compare
          (compact_fkhash_nlm<int,_16UL> *this,uint64_t pos,char_range *key)

{
  ulong uVar1;
  bool bVar2;
  uint8_t uVar3;
  size_type sVar4;
  uint64_t uVar5;
  char_range *in_RDX;
  vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  *in_RDI;
  uint64_t i_1;
  uint64_t length;
  uint64_t i;
  uint64_t alloc;
  type *pos_in_chunk;
  type *chunk_id;
  uint8_t *char_ptr;
  unsigned_long local_a0;
  int *local_98;
  void *local_90;
  void *local_88;
  unsigned_long local_80;
  ulong local_78;
  int local_6c;
  int *local_68;
  ulong local_60;
  uint64_t local_58;
  ulong *local_50;
  ulong *local_48;
  pair<unsigned_long,_unsigned_long> local_40;
  int *local_30;
  char_range *local_28;
  pair<const_int_*,_unsigned_long> local_10;
  
  local_30 = (int *)0x0;
  local_28 = in_RDX;
  local_40 = decompose_value<16ul>((uint64_t)in_RDI);
  local_48 = std::get<0ul,unsigned_long,unsigned_long>
                       ((pair<unsigned_long,_unsigned_long> *)0x1448ec);
  local_50 = std::get<1ul,unsigned_long,unsigned_long>
                       ((pair<unsigned_long,_unsigned_long> *)0x1448fb);
  uVar1 = *local_48;
  sVar4 = std::
          vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
          ::size(in_RDI);
  if (uVar1 < sVar4) {
    std::
    vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
    ::operator[](in_RDI,*local_48);
    local_30 = (int *)std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                                ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                  *)in_RDI);
  }
  else {
    local_30 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x144956);
  }
  local_58 = 0;
  for (local_60 = 0; local_60 < *local_50; local_60 = local_60 + 1) {
    uVar5 = vbyte::decode((uint8_t *)local_30,&local_58);
    local_30 = (int *)((long)local_30 + local_58 + uVar5);
  }
  uVar5 = vbyte::decode((uint8_t *)local_30,&local_58);
  local_30 = (int *)((long)local_30 + uVar5);
  bVar2 = char_range::empty(local_28);
  if (bVar2) {
    local_68 = local_30;
    local_6c = 0;
    std::pair<const_int_*,_unsigned_long>::pair<const_int_*,_int,_true>
              (&local_10,&local_68,&local_6c);
  }
  else {
    local_78 = local_58 - 4;
    for (local_80 = 0; local_80 < local_78; local_80 = local_80 + 1) {
      uVar3 = char_range::operator[](local_28,local_80);
      if (uVar3 != *(uint8_t *)((long)local_30 + local_80)) {
        local_88 = (void *)0x0;
        std::pair<const_int_*,_unsigned_long>::pair<std::nullptr_t,_unsigned_long_&,_true>
                  (&local_10,&local_88,&local_80);
        return local_10;
      }
    }
    uVar3 = char_range::operator[](local_28,local_78);
    if (uVar3 == '\0') {
      local_98 = (int *)((long)local_30 + local_78);
      local_a0 = local_78 + 1;
      std::pair<const_int_*,_unsigned_long>::pair<const_int_*,_unsigned_long,_true>
                (&local_10,&local_98,&local_a0);
    }
    else {
      local_90 = (void *)0x0;
      std::pair<const_int_*,_unsigned_long>::pair<std::nullptr_t,_unsigned_long_&,_true>
                (&local_10,&local_90,&local_78);
    }
  }
  return local_10;
}

Assistant:

std::pair<const value_type*, uint64_t> compare(uint64_t pos, const char_range& key) const {
        assert(pos < size_);

        const uint8_t* char_ptr = nullptr;
        auto [chunk_id, pos_in_chunk] = decompose_value<ChunkSize>(pos);

        if (chunk_id < chunk_ptrs_.size()) {
            char_ptr = chunk_ptrs_[chunk_id].get();
        } else {
            assert(chunk_id == chunk_ptrs_.size());
            char_ptr = chunk_buf_.data();
        }

        uint64_t alloc = 0;
        for (uint64_t i = 0; i < pos_in_chunk; ++i) {
            char_ptr += vbyte::decode(char_ptr, alloc);
            char_ptr += alloc;
        }
        char_ptr += vbyte::decode(char_ptr, alloc);

        if (key.empty()) {
            return {reinterpret_cast<const value_type*>(char_ptr), 0};
        }

        assert(sizeof(value_type) <= alloc);

        uint64_t length = alloc - sizeof(value_type);
        for (uint64_t i = 0; i < length; ++i) {
            if (key[i] != char_ptr[i]) {
                return {nullptr, i};
            }
        }

        if (key[length] != '\0') {
            return {nullptr, length};
        }

        // +1 considers the terminator '\0'
        return {reinterpret_cast<const value_type*>(char_ptr + length), length + 1};
    }